

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  void *pvVar8;
  uint i;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  int64_t *ptr;
  int64_t *ptr_00;
  ulong *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  ulong uVar20;
  int64_t iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  char *pcVar26;
  long lVar27;
  longlong extraout_RDX;
  ulong uVar29;
  int64_t *piVar30;
  int iVar31;
  int64_t *col;
  char *__format;
  int iVar32;
  long lVar33;
  int32_t j;
  ulong uVar34;
  int64_t *piVar35;
  int64_t *piVar36;
  int64_t *piVar37;
  bool bVar38;
  uint extraout_XMM0_Da;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_02;
  uint extraout_XMM0_Db;
  ulong extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  ulong uVar39;
  int64_t *piVar40;
  uint extraout_XMM0_Dc;
  __m128i_64_t B_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong extraout_XMM0_Qb_02;
  uint extraout_XMM0_Dd;
  ulong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  undefined1 extraout_XMM0 [16];
  ulong extraout_XMM0_Qb_05;
  int64_t *piVar49;
  undefined1 extraout_XMM0_00 [16];
  int iVar58;
  __m128i_64_t A_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong uVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar60;
  int64_t *piVar61;
  __m128i_64_t A;
  ulong uVar62;
  ulong uVar63;
  int iVar68;
  ulong uVar69;
  ulong uVar70;
  int iVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int64_t *piVar72;
  __m128i_64_t A_3;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int64_t *piVar73;
  int64_t *piVar80;
  undefined1 auVar79 [16];
  int64_t *piVar81;
  __m128i_64_t A_4;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int64_t *piVar84;
  __m128i_64_t A_5;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i_64_t B;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  __m128i_64_t B_6;
  ulong uVar92;
  __m128i alVar91;
  ulong uVar93;
  ulong uVar94;
  __m128i_64_t B_5;
  ulong uVar96;
  __m128i alVar95;
  ulong uVar97;
  ulong uVar98;
  __m128i_64_t B_4;
  ulong uVar100;
  __m128i alVar99;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i alVar101;
  __m128i alVar102;
  undefined1 local_398 [16];
  undefined8 local_358;
  undefined8 uStack_350;
  ulong uStack_340;
  undefined4 local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  ulong uStack_310;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  ulong uStack_2a0;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  uint local_220;
  int iStack_21c;
  undefined1 local_1e8 [16];
  int64_t *piStack_1d0;
  long local_1c8;
  long lStack_1c0;
  undefined8 uStack_120;
  ulong uStack_110;
  ulong uStack_b0;
  __m128i cond_valid_I;
  longlong lVar28;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar26 = "_s2";
LAB_005d085d:
    fprintf(_stderr,__format,"parasail_nw_stats_rowcol_diag_sse2_128_64",pcVar26);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar26 = "s2Len";
    goto LAB_005d085d;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar26 = "open";
    goto LAB_005d085d;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar26 = "gap";
    goto LAB_005d085d;
  }
  uVar24 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar26 = "matrix";
    goto LAB_005d085d;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_nw_stats_rowcol_diag_sse2_128_64");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar26 = "_s1";
      goto LAB_005d085d;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar26 = "_s1Len";
      goto LAB_005d085d;
    }
    if (matrix->type == 0) goto LAB_005cf42c;
  }
  uVar24 = (ulong)(uint)matrix->length;
LAB_005cf42c:
  iVar60 = matrix->min;
  iVar31 = -open;
  uVar29 = 0x8000000000000000 - (long)iVar60;
  if (iVar60 != iVar31 && SBORROW4(iVar60,iVar31) == iVar60 + open < 0) {
    uVar29 = (ulong)(uint)open | 0x8000000000000000;
  }
  iVar60 = matrix->max;
  iVar32 = (int)uVar24;
  ppVar19 = parasail_result_new_rowcol3(iVar32,s2Len);
  if (ppVar19 != (parasail_result_t *)0x0) {
    ppVar19->flag = ppVar19->flag | 0x2851001;
    ptr = parasail_memalign_int64_t(0x10,(long)(iVar32 + 1));
    uVar20 = (ulong)(s2Len + 2);
    ptr_00 = parasail_memalign_int64_t(0x10,uVar20);
    ptr_01 = (ulong *)parasail_memalign_int64_t(0x10,uVar20);
    ptr_02 = parasail_memalign_int64_t(0x10,uVar20);
    ptr_03 = parasail_memalign_int64_t(0x10,uVar20);
    ptr_04 = parasail_memalign_int64_t(0x10,uVar20);
    ptr_05 = parasail_memalign_int64_t(0x10,uVar20);
    ptr_06 = parasail_memalign_int64_t(0x10,uVar20);
    ptr_07 = parasail_memalign_int64_t(0x10,uVar20);
    ptr_08 = parasail_memalign_int64_t(0x10,uVar20);
    auVar41._0_4_ = -(uint)((int)ptr == 0);
    auVar41._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
    auVar41._8_4_ = -(uint)((int)ptr_00 == 0);
    auVar41._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
    auVar85._4_4_ = auVar41._0_4_;
    auVar85._0_4_ = auVar41._4_4_;
    auVar85._8_4_ = auVar41._12_4_;
    auVar85._12_4_ = auVar41._8_4_;
    auVar51._0_4_ = -(uint)((int)ptr_01 == 0);
    auVar51._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
    auVar51._8_4_ = -(uint)((int)ptr_02 == 0);
    auVar51._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
    auVar86._4_4_ = auVar51._0_4_;
    auVar86._0_4_ = auVar51._4_4_;
    auVar86._8_4_ = auVar51._12_4_;
    auVar86._12_4_ = auVar51._8_4_;
    auVar86 = packssdw(auVar85 & auVar41,auVar86 & auVar51);
    auVar64._0_4_ = -(uint)((int)ptr_03 == 0);
    auVar64._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
    auVar64._8_4_ = -(uint)((int)ptr_04 == 0);
    auVar64._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
    auVar44._4_4_ = auVar64._0_4_;
    auVar44._0_4_ = auVar64._4_4_;
    auVar44._8_4_ = auVar64._12_4_;
    auVar44._12_4_ = auVar64._8_4_;
    auVar74._0_4_ = -(uint)((int)ptr_05 == 0);
    auVar74._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
    auVar74._8_4_ = -(uint)((int)ptr_06 == 0);
    auVar74._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
    auVar54._4_4_ = auVar74._0_4_;
    auVar54._0_4_ = auVar74._4_4_;
    auVar54._8_4_ = auVar74._12_4_;
    auVar54._12_4_ = auVar74._8_4_;
    auVar41 = packssdw(auVar44 & auVar64,auVar54 & auVar74);
    auVar41 = packssdw(auVar86,auVar41);
    uVar20 = 0;
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf]))
    {
      uVar14 = (ulong)(uint)s2Len;
      uVar22 = iVar32 - 1;
      iVar23 = s2Len + -1;
      piVar30 = (int64_t *)(uVar29 + 1);
      local_1e8._0_8_ = 0x7ffffffffffffffe - (long)iVar60;
      auVar42._8_4_ = (int)piVar30;
      auVar42._0_8_ = piVar30;
      auVar42._12_4_ = (int)((ulong)piVar30 >> 0x20);
      auVar43._8_4_ = (int)local_1e8._0_8_;
      auVar43._0_8_ = local_1e8._0_8_;
      auVar43._12_4_ = (int)((ulong)local_1e8._0_8_ >> 0x20);
      lVar33 = (long)iVar32;
      b[0] = (long)iVar31;
      local_1c8 = (long)(iVar31 - gap);
      uVar88 = 0;
      if (0 < iVar32) {
        uVar88 = uVar24;
      }
      for (; lVar27 = lVar33, uVar88 != uVar20; uVar20 = uVar20 + 1) {
        ptr[uVar20] = (long)matrix->mapper[(byte)_s1[uVar20]];
      }
      for (; lVar27 <= lVar33; lVar27 = lVar27 + 1) {
        ptr[lVar27] = 0;
      }
      a[0] = matrix->mapper;
      for (uVar24 = 0; uVar14 != uVar24; uVar24 = uVar24 + 1) {
        ptr_00[uVar24 + 1] = (long)a[0][(byte)_s2[uVar24]];
      }
      *ptr_00 = 0;
      for (uVar24 = uVar14; (int)uVar24 <= s2Len; uVar24 = uVar24 + 1) {
        ptr_00[uVar24 + 1] = 0;
      }
      uVar24 = (ulong)(uint)gap;
      lVar27 = b[0];
      for (lVar25 = 0; uVar14 * 8 - lVar25 != 0; lVar25 = lVar25 + 8) {
        *(long *)((long)ptr_01 + lVar25 + 8) = lVar27;
        *(undefined8 *)((long)ptr_02 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_03 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_04 + lVar25 + 8) = 0;
        *(int64_t **)((long)ptr_05 + lVar25 + 8) = piVar30;
        *(undefined8 *)((long)ptr_06 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_07 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_08 + lVar25 + 8) = 0;
        lVar27 = lVar27 - uVar24;
      }
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = 0;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      b[1] = ptr_07 + uVar14 + 1;
      col = ptr_05 + uVar14 + 1;
      for (lVar27 = 0; s2Len + (int)lVar27 <= s2Len; lVar27 = lVar27 + 1) {
        ptr_01[uVar14 + lVar27 + 1] = 0;
        ptr_02[uVar14 + lVar27 + 1] = 0;
        ptr_03[uVar14 + lVar27 + 1] = 0;
        ptr_04[uVar14 + lVar27 + 1] = 0;
        col[lVar27] = 0;
        ptr_06[uVar14 + lVar27 + 1] = 0;
        b[1][lVar27] = 0;
        ptr_08[uVar14 + lVar27 + 1] = 0;
      }
      *ptr_01 = 0;
      uVar20 = 0;
      uStack_120 = auVar43._8_8_;
      local_1e8._8_8_ = uStack_120;
      piStack_1d0 = auVar42._8_8_;
      piVar61 = piVar30;
      piVar40 = piVar30;
      piVar49 = piStack_1d0;
      piVar81 = piVar30;
      piVar84 = piStack_1d0;
      piVar72 = piVar30;
      piVar80 = piStack_1d0;
      lStack_1c0 = b[0];
      while ((long)uVar20 < lVar33) {
        piVar35 = (int64_t *)matrix->matrix;
        i = (uint)uVar20;
        uVar18 = i | 1;
        if (lVar33 <= (long)(uVar20 | 1)) {
          uVar18 = uVar22;
        }
        a[0] = (int *)(long)matrix->size;
        iVar21 = (int64_t)(int)uVar18;
        uVar88 = uVar20;
        if (matrix->type == 0) {
          iVar21 = ptr[uVar20 + 1];
          uVar88 = ptr[uVar20];
        }
        lVar25 = uVar88 * (long)a[0];
        piVar1 = (int *)((long)piVar35 + iVar21 * (long)a[0] * 4);
        local_328 = 0;
        uStack_324 = 0;
        uStack_320 = (undefined4)*ptr_01;
        uStack_31c = (undefined4)(*ptr_01 >> 0x20);
        lVar27 = uVar20 * uVar24;
        uVar20 = uVar20 + 2;
        b[1] = (int64_t *)(b[0] - uVar20 * uVar24);
        *ptr_01 = (ulong)b[1];
        a[1] = (longlong)piVar35;
        col = piVar35;
        alVar101 = _mm_cmpeq_epi64_rpl(a,b);
        lVar28 = alVar101[1];
        local_398._0_8_ = 0;
        uVar98 = 0;
        uVar94 = 0;
        piVar36 = (int64_t *)0x0;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = piVar30;
        local_2e8 = auVar15 << 0x40;
        local_258 = (undefined1  [16])0x0;
        local_268 = (undefined1  [16])0x0;
        local_248 = (undefined1  [16])0x0;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = piVar30;
        local_2d8 = auVar16 << 0x40;
        local_2b8 = 0;
        uStack_2b0 = 0;
        local_2c8 = 0;
        uStack_2c0 = 0;
        local_2a8 = 0;
        uStack_2a0 = 0;
        uStack_350 = 0;
        uStack_310 = 0;
        uStack_340 = 0;
        uVar88 = b[0] - lVar27;
        uVar39 = 0;
        uVar59 = 0;
        uVar97 = 0;
        uVar100 = 0;
        uVar93 = 0;
        uVar96 = 0;
        for (uVar34 = 0; uVar89 = uStack_340, uVar92 = uStack_310, uVar90 = uStack_350,
            uVar34 <= uVar14; uVar34 = uVar34 + 1) {
          uVar2 = ptr_01[uVar34 + 1];
          uVar3 = ptr_02[uVar34 + 1];
          uVar4 = ptr_03[uVar34 + 1];
          uVar5 = ptr_04[uVar34 + 1];
          uVar17 = local_2d8._8_8_;
          lVar27 = ptr_05[uVar34 + 1];
          uVar63 = ptr_06[uVar34 + 1];
          uVar70 = ptr_07[uVar34 + 1];
          uVar6 = ptr_08[uVar34 + 1];
          local_2d8._8_8_ = uVar2 - (uint)open;
          local_2d8._0_8_ = uVar88 - (uint)open;
          uStack_110 = (ulong)(uint)gap;
          alVar101[1] = (longlong)b[1];
          alVar101[0] = lVar28;
          a_00[1] = (longlong)col;
          a_00[0] = (longlong)a[0];
          alVar101 = _mm_cmpgt_epi64_rpl(a_00,alVar101);
          alVar91[0] = alVar101[1];
          uVar62 = extraout_XMM0_Qa_00 & uVar92 |
                   ~extraout_XMM0_Qa_00 & CONCAT44(local_2b8._4_4_,(uint)uStack_2b0);
          uVar69 = extraout_XMM0_Qb_00 & uVar3 | ~extraout_XMM0_Qb_00 & uVar63;
          uVar63 = extraout_XMM0_Qa_00 & uVar90 |
                   ~extraout_XMM0_Qa_00 & CONCAT44(local_2c8._4_4_,(uint)uStack_2c0);
          uVar70 = extraout_XMM0_Qb_00 & uVar4 | ~extraout_XMM0_Qb_00 & uVar70;
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          local_2a8 = (extraout_XMM0_Qa_00 & uVar89 |
                      ~extraout_XMM0_Qa_00 & CONCAT44(local_2a8._4_4_,(undefined4)uStack_2a0)) + 1;
          uStack_2a0 = (extraout_XMM0_Qb_00 & uVar5 | ~extraout_XMM0_Qb_00 & uVar6) - auVar50._8_8_;
          local_398._8_8_ = uVar88 - (uint)open;
          local_398._0_8_ = local_398._0_8_ - (ulong)(uint)open;
          local_2e8._8_8_ = local_2e8._8_8_ - uStack_110;
          local_2e8._0_8_ = local_2e8._0_8_ - (ulong)(uint)gap;
          alVar91[1] = (longlong)b[1];
          a_01[1] = (longlong)col;
          a_01[0] = (longlong)a[0];
          _mm_cmpgt_epi64_rpl(a_01,alVar91);
          local_258._0_8_ = uVar98 & extraout_XMM0_Qa_01 | ~extraout_XMM0_Qa_01 & local_258._0_8_;
          local_258._8_8_ = uVar92 & extraout_XMM0_Qb_01 | ~extraout_XMM0_Qb_01 & local_258._8_8_;
          auVar86 = local_258;
          local_268._0_8_ = uVar94 & extraout_XMM0_Qa_01 | ~extraout_XMM0_Qa_01 & local_268._0_8_;
          local_268._8_8_ = uVar90 & extraout_XMM0_Qb_01 | ~extraout_XMM0_Qb_01 & local_268._8_8_;
          auVar41 = local_268;
          local_248._0_8_ =
               (extraout_XMM0_Qa_01 & (ulong)piVar36 | ~extraout_XMM0_Qa_01 & local_248._0_8_) + 1;
          local_248._8_8_ =
               (extraout_XMM0_Qb_01 & uVar89 | ~extraout_XMM0_Qb_01 & local_248._8_8_) + 1;
          alVar95[1] = (long)*(int *)((long)piVar35 + ptr_00[uVar34 + 1] * 4 + lVar25 * 4);
          auVar87._0_8_ = CONCAT44(uStack_324,local_328) + (long)piVar1[ptr_00[uVar34]];
          auVar87._8_8_ = CONCAT44(uStack_31c,uStack_320) + alVar95[1];
          auVar13._8_8_ = lVar27 - uStack_110;
          auVar13._0_8_ = uVar17 - (ulong)(uint)gap;
          auVar44 = auVar13 ^ _DAT_008a1890;
          auVar51 = local_2d8 ^ _DAT_008a1890;
          iVar60 = -(uint)(auVar44._0_4_ < auVar51._0_4_);
          iVar68 = -(uint)(auVar44._4_4_ < auVar51._4_4_);
          iVar31 = -(uint)(auVar44._8_4_ < auVar51._8_4_);
          iVar71 = -(uint)(auVar44._12_4_ < auVar51._12_4_);
          auVar75._4_4_ = iVar60;
          auVar75._0_4_ = iVar60;
          auVar75._8_4_ = iVar31;
          auVar75._12_4_ = iVar31;
          iVar60 = -(uint)(auVar51._4_4_ == auVar44._4_4_);
          iVar31 = -(uint)(auVar51._12_4_ == auVar44._12_4_);
          auVar45._4_4_ = iVar60;
          auVar45._0_4_ = iVar60;
          auVar45._8_4_ = iVar31;
          auVar45._12_4_ = iVar31;
          auVar52._4_4_ = iVar68;
          auVar52._0_4_ = iVar68;
          auVar52._8_4_ = iVar71;
          auVar52._12_4_ = iVar71;
          auVar52 = auVar52 | auVar45 & auVar75;
          local_2d8 = ~auVar52 & auVar13 | local_2d8 & auVar52;
          auVar44 = local_2e8 ^ _DAT_008a1890;
          auVar51 = local_398 ^ _DAT_008a1890;
          iVar60 = -(uint)(auVar44._0_4_ < auVar51._0_4_);
          iVar68 = -(uint)(auVar44._4_4_ < auVar51._4_4_);
          iVar31 = -(uint)(auVar44._8_4_ < auVar51._8_4_);
          iVar71 = -(uint)(auVar44._12_4_ < auVar51._12_4_);
          auVar76._4_4_ = iVar60;
          auVar76._0_4_ = iVar60;
          auVar76._8_4_ = iVar31;
          auVar76._12_4_ = iVar31;
          iVar60 = -(uint)(auVar51._4_4_ == auVar44._4_4_);
          iVar31 = -(uint)(auVar51._12_4_ == auVar44._12_4_);
          auVar46._4_4_ = iVar60;
          auVar46._0_4_ = iVar60;
          auVar46._8_4_ = iVar31;
          auVar46._12_4_ = iVar31;
          auVar53._4_4_ = iVar68;
          auVar53._0_4_ = iVar68;
          auVar53._8_4_ = iVar71;
          auVar53._12_4_ = iVar71;
          auVar53 = auVar53 | auVar46 & auVar76;
          auVar51 = ~auVar53 & local_2e8 | local_398 & auVar53;
          auVar44 = auVar51 ^ _DAT_008a1890;
          auVar54 = auVar87 ^ _DAT_008a1890;
          iVar60 = -(uint)(auVar44._0_4_ < auVar54._0_4_);
          iVar68 = -(uint)(auVar44._4_4_ < auVar54._4_4_);
          iVar31 = -(uint)(auVar44._8_4_ < auVar54._8_4_);
          iVar71 = -(uint)(auVar44._12_4_ < auVar54._12_4_);
          auVar77._4_4_ = iVar60;
          auVar77._0_4_ = iVar60;
          auVar77._8_4_ = iVar31;
          auVar77._12_4_ = iVar31;
          iVar60 = -(uint)(auVar54._4_4_ == auVar44._4_4_);
          iVar31 = -(uint)(auVar54._12_4_ == auVar44._12_4_);
          auVar47._4_4_ = iVar60;
          auVar47._0_4_ = iVar60;
          auVar47._8_4_ = iVar31;
          auVar47._12_4_ = iVar31;
          auVar55._4_4_ = iVar68;
          auVar55._0_4_ = iVar68;
          auVar55._8_4_ = iVar71;
          auVar55._12_4_ = iVar71;
          auVar55 = auVar55 | auVar47 & auVar77;
          auVar54 = ~auVar55 & auVar51 | auVar87 & auVar55;
          auVar44 = auVar54 ^ _DAT_008a1890;
          auVar64 = local_2d8 ^ _DAT_008a1890;
          iVar60 = -(uint)(auVar64._0_4_ < auVar44._0_4_);
          iVar31 = -(uint)(auVar64._4_4_ < auVar44._4_4_);
          iVar68 = -(uint)(auVar64._8_4_ < auVar44._8_4_);
          iVar71 = -(uint)(auVar64._12_4_ < auVar44._12_4_);
          auVar82._4_4_ = iVar60;
          auVar82._0_4_ = iVar60;
          auVar82._8_4_ = iVar68;
          auVar82._12_4_ = iVar68;
          auVar65._4_4_ = -(uint)(auVar64._4_4_ == auVar44._4_4_);
          auVar65._12_4_ = -(uint)(auVar64._12_4_ == auVar44._12_4_);
          auVar65._0_4_ = auVar65._4_4_;
          auVar65._8_4_ = auVar65._12_4_;
          auVar48._4_4_ = iVar31;
          auVar48._0_4_ = iVar31;
          auVar48._8_4_ = iVar71;
          auVar48._12_4_ = iVar71;
          auVar48 = auVar48 | auVar65 & auVar82;
          alVar95[0] = (longlong)piVar1;
          a_02[1] = (longlong)col;
          a_02[0] = (longlong)a[0];
          alVar101 = _mm_cmpeq_epi64_rpl(a_02,alVar95);
          alVar99[0] = alVar101[1];
          alVar99[1] = alVar95[1];
          a_03[1] = (longlong)col;
          a_03[0] = (longlong)a[0];
          alVar101 = _mm_cmpeq_epi64_rpl(a_03,alVar99);
          alVar102[0] = alVar101[1];
          local_358 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          uStack_350._0_4_ = extraout_XMM0_Dc;
          uStack_350._4_4_ = extraout_XMM0_Dd;
          local_258._4_4_ = (undefined4)((ulong)local_258._0_8_ >> 0x20);
          local_258._12_4_ = (undefined4)((ulong)local_258._8_8_ >> 0x20);
          local_2b8._0_4_ = (uint)uVar62;
          local_2b8._4_4_ = (uint)(uVar62 >> 0x20);
          uStack_2b0._0_4_ = (uint)uVar69;
          uStack_2b0._4_4_ = (uint)(uVar69 >> 0x20);
          alVar102[1] = alVar95[1];
          a_04[1] = (longlong)col;
          a_04[0] = (longlong)a[0];
          alVar101 = _mm_cmpeq_epi64_rpl(a_04,alVar102);
          b_00[0] = alVar101[1];
          uVar59 = (extraout_XMM0_Qb_03 & 1) + uVar59 & extraout_XMM0_Qb_02 |
                   ~extraout_XMM0_Qb_02 &
                   CONCAT44(extraout_XMM0_Dd & uStack_2b0._4_4_ |
                            ~extraout_XMM0_Dd & local_258._12_4_,
                            extraout_XMM0_Dc & (uint)uStack_2b0 |
                            ~extraout_XMM0_Dc & local_258._8_4_);
          uStack_320 = (undefined4)uVar59;
          uStack_31c = (undefined4)(uVar59 >> 0x20);
          local_268._4_4_ = (undefined4)((ulong)local_268._0_8_ >> 0x20);
          local_268._12_4_ = (undefined4)((ulong)local_268._8_8_ >> 0x20);
          local_2c8._0_4_ = (uint)uVar63;
          local_2c8._4_4_ = (uint)(uVar63 >> 0x20);
          uStack_2c0._0_4_ = (uint)uVar70;
          uStack_2c0._4_4_ = (uint)(uVar70 >> 0x20);
          local_288 = CONCAT44(extraout_XMM0_Db & local_2c8._4_4_ |
                               ~extraout_XMM0_Db & local_268._4_4_,
                               extraout_XMM0_Da & (uint)local_2c8 |
                               ~extraout_XMM0_Da & local_268._0_4_);
          uStack_280 = CONCAT44(extraout_XMM0_Dd & uStack_2c0._4_4_ |
                                ~extraout_XMM0_Dd & local_268._12_4_,
                                extraout_XMM0_Dc & (uint)uStack_2c0 |
                                ~extraout_XMM0_Dc & local_268._8_4_);
          b_00[1] = alVar95[1];
          a_05[1] = (longlong)col;
          a_05[0] = (longlong)a[0];
          alVar101 = _mm_cmpgt_epi64_rpl(a_05,b_00);
          b_01[0] = alVar101[1];
          b_01[1] = alVar95[1];
          a_06[1] = (longlong)col;
          a_06[0] = (longlong)a[0];
          _mm_cmpeq_epi64_rpl(a_06,b_01);
          auVar12._8_8_ = lStack_1c0;
          auVar12._0_8_ = local_1c8;
          alVar101 = (__m128i)(extraout_XMM0 & auVar12 |
                              ~extraout_XMM0 & (~auVar48 & local_2d8 | auVar54 & auVar48));
          auVar9._8_4_ = uStack_320;
          auVar9._0_8_ = (extraout_XMM0_Qa_03 & 1) + uVar39 & extraout_XMM0_Qa_02 |
                         ~extraout_XMM0_Qa_02 &
                         CONCAT44(extraout_XMM0_Db & local_2b8._4_4_ |
                                  ~extraout_XMM0_Db & local_258._4_4_,
                                  extraout_XMM0_Da & (uint)local_2b8 |
                                  ~extraout_XMM0_Da & local_258._0_4_);
          auVar9._12_4_ = uStack_31c;
          alVar99 = (__m128i)(~extraout_XMM0 & auVar9);
          auVar10._8_8_ =
               (extraout_XMM0_Qb_04 & 1) + uVar100 & extraout_XMM0_Qb_02 |
               ~extraout_XMM0_Qb_02 & uStack_280;
          auVar10._0_8_ =
               (extraout_XMM0_Qa_04 & 1) + uVar97 & extraout_XMM0_Qa_02 |
               ~extraout_XMM0_Qa_02 & local_288;
          alVar95 = (__m128i)(~extraout_XMM0 & auVar10);
          auVar11._8_8_ =
               uVar96 + 1 & extraout_XMM0_Qb_02 |
               ~extraout_XMM0_Qb_02 & (uStack_350 & uStack_2a0 | ~uStack_350 & local_248._8_8_);
          auVar11._0_8_ =
               uVar93 + 1 & extraout_XMM0_Qa_02 |
               ~extraout_XMM0_Qa_02 & (local_358 & local_2a8 | ~local_358 & local_248._0_8_);
          alVar91 = (__m128i)(~extraout_XMM0 & auVar11);
          uVar98 = alVar99[0];
          uVar94 = alVar95[0];
          piVar36 = alVar91[0];
          local_398._0_8_ = alVar101[0];
          if (1 < uVar34) {
            auVar44 = local_1e8 ^ _DAT_008a1890;
            auVar54 = (undefined1  [16])alVar101 ^ _DAT_008a1890;
            iVar60 = -(uint)(auVar44._0_4_ < auVar54._0_4_);
            auVar78._4_4_ = -(uint)(auVar44._4_4_ < auVar54._4_4_);
            iVar31 = -(uint)(auVar44._8_4_ < auVar54._8_4_);
            auVar78._12_4_ = -(uint)(auVar44._12_4_ < auVar54._12_4_);
            auVar83._4_4_ = iVar60;
            auVar83._0_4_ = iVar60;
            auVar83._8_4_ = iVar31;
            auVar83._12_4_ = iVar31;
            auVar56._4_4_ = -(uint)(auVar44._4_4_ == auVar54._4_4_);
            auVar56._12_4_ = -(uint)(auVar44._12_4_ == auVar54._12_4_);
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar78._0_4_ = auVar78._4_4_;
            auVar78._8_4_ = auVar78._12_4_;
            auVar78 = auVar78 | auVar56 & auVar83;
            local_1e8 = local_1e8 & auVar78 | ~auVar78 & (undefined1  [16])alVar101;
          }
          local_2e8 = ~extraout_XMM0 & auVar51 | extraout_XMM0 & auVar42;
          local_258 = ~extraout_XMM0 & auVar86;
          local_268 = ~extraout_XMM0 & auVar41;
          local_248 = ~extraout_XMM0 & local_248;
          puVar7 = (undefined8 *)((ppVar19->field_4).trace)->trace_del_table;
          j = (int32_t)uVar34;
          arr_store_rowcol((int *)*puVar7,(int *)puVar7[4],alVar101,i,iVar32,j,s2Len);
          pvVar8 = ((ppVar19->field_4).trace)->trace_del_table;
          arr_store_rowcol(*(int **)((long)pvVar8 + 8),*(int **)((long)pvVar8 + 0x28),alVar99,i,
                           iVar32,j,s2Len);
          pvVar8 = ((ppVar19->field_4).trace)->trace_del_table;
          arr_store_rowcol(*(int **)((long)pvVar8 + 0x10),*(int **)((long)pvVar8 + 0x30),alVar95,i,
                           iVar32,j,s2Len);
          pvVar8 = ((ppVar19->field_4).trace)->trace_del_table;
          a[0] = *(int **)((long)pvVar8 + 0x18);
          col = *(int64_t **)((long)pvVar8 + 0x38);
          arr_store_rowcol(a[0],(int *)col,alVar91,i,iVar32,j,s2Len);
          ptr_01[uVar34] = local_398._0_8_;
          ptr_02[uVar34] = uVar98;
          ptr_03[uVar34] = uVar94;
          ptr_04[uVar34] = (int64_t)piVar36;
          ptr_05[uVar34] = local_2d8._0_8_;
          ptr_06[uVar34] = uVar62;
          ptr_07[uVar34] = uVar63;
          ptr_08[uVar34] = local_2a8;
          b_02[1] = (longlong)piVar36;
          b_02[0] = extraout_RDX;
          a_07[1] = (longlong)col;
          a_07[0] = (longlong)a[0];
          b[1] = piVar36;
          alVar102 = _mm_cmpeq_epi64_rpl(a_07,b_02);
          lVar28 = alVar102[1];
          local_398._8_8_ = alVar101[1];
          uVar39 = extraout_XMM0_Qa_05 & extraout_XMM0_Qa;
          uVar59 = extraout_XMM0_Qb_05 & extraout_XMM0_Qb;
          piVar61 = (int64_t *)(uVar39 & local_398._0_8_ | ~uVar39 & (ulong)piVar61);
          piStack_1d0 = (int64_t *)(uVar59 & local_398._8_8_ | ~uVar59 & (ulong)piStack_1d0);
          uStack_310 = alVar99[1];
          piVar72 = (int64_t *)(uVar39 & uVar98 | ~uVar39 & (ulong)piVar72);
          piVar80 = (int64_t *)(uVar59 & uStack_310 | ~uVar59 & (ulong)piVar80);
          uStack_350 = alVar95[1];
          piVar81 = (int64_t *)(uVar39 & uVar94 | ~uVar39 & (ulong)piVar81);
          piVar84 = (int64_t *)(uVar59 & uStack_350 | ~uVar59 & (ulong)piVar84);
          uStack_340 = alVar91[1];
          piVar40 = (int64_t *)(uVar39 & (ulong)piVar36 | ~uVar39 & (ulong)piVar40);
          piVar49 = (int64_t *)(uVar59 & uStack_340 | ~uVar59 & (ulong)piVar49);
          local_328 = (undefined4)uVar88;
          uStack_324 = (undefined4)(uVar88 >> 0x20);
          uStack_320 = (undefined4)uVar2;
          uStack_31c = (undefined4)(uVar2 >> 0x20);
          uVar88 = local_398._8_8_;
          uVar39 = uVar92;
          uVar59 = uVar3;
          uVar97 = uVar90;
          uVar100 = uVar4;
          uVar93 = uVar89;
          uVar96 = uVar5;
          local_2c8 = uVar63;
          uStack_2c0 = uVar70;
          local_2b8 = uVar62;
          uStack_2b0 = uVar69;
        }
        uStack_b0 = (ulong)(uint)(gap * 2);
        local_1c8 = local_1c8 - (ulong)(uint)(gap * 2);
        lStack_1c0 = lStack_1c0 - uStack_b0;
      }
      iVar60 = 2;
      piVar35 = piVar30;
      piVar36 = piVar30;
      piVar37 = piVar30;
      while( true ) {
        piVar73 = piVar72;
        piVar72 = piVar81;
        piVar81 = piVar40;
        piVar40 = piVar61;
        iVar68 = (int)piVar37;
        iVar32 = (int)piVar36;
        iVar31 = (int)piVar30;
        bVar38 = iVar60 == 0;
        iVar60 = iVar60 + -1;
        if (bVar38) break;
        if ((long)piVar35 < (long)piStack_1d0) {
          piVar30 = piVar80;
          piVar35 = piStack_1d0;
          piVar36 = piVar84;
          piVar37 = piVar49;
        }
        b[1] = piStack_1d0;
        piVar61 = (int64_t *)0x0;
        piStack_1d0 = piVar40;
        piVar40 = (int64_t *)0x0;
        piVar49 = piVar81;
        piVar81 = (int64_t *)0x0;
        piVar84 = piVar72;
        piVar72 = (int64_t *)0x0;
        piVar80 = piVar73;
      }
      local_220 = (uint)uVar29;
      iStack_21c = (int)(uVar29 >> 0x20);
      b_03[1] = (longlong)b[1];
      b_03[0] = (longlong)ptr;
      a_08[1] = (longlong)col;
      a_08[0] = (longlong)matrix;
      _mm_cmpgt_epi64_rpl(a_08,b_03);
      iVar60 = (int)piVar35;
      iVar71 = -(uint)((int)(local_220 ^ 0x80000000) < (int)(local_1e8._0_4_ ^ 0x80000000));
      auVar57._4_4_ = -(uint)(iStack_21c < (int)local_1e8._4_4_);
      iVar58 = -(uint)((int)(local_220 ^ 0x80000000) < (int)(local_1e8._8_4_ ^ 0x80000000));
      auVar57._12_4_ = -(uint)(iStack_21c < (int)local_1e8._12_4_);
      auVar66._4_4_ = iVar71;
      auVar66._0_4_ = iVar71;
      auVar66._8_4_ = iVar58;
      auVar66._12_4_ = iVar58;
      auVar79._4_4_ = -(uint)(iStack_21c == local_1e8._4_4_);
      auVar79._0_4_ = -(uint)(iStack_21c == local_1e8._4_4_);
      auVar79._8_4_ = -(uint)(iStack_21c == local_1e8._12_4_);
      auVar79._12_4_ = -(uint)(iStack_21c == local_1e8._12_4_);
      auVar57._0_4_ = auVar57._4_4_;
      auVar57._8_4_ = auVar57._12_4_;
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar41 = auVar67 ^ (auVar57 | auVar79 & auVar66) | extraout_XMM0_00;
      if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar41 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar41 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0'
         ) {
        *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
        uVar22 = 0;
        iVar23 = 0;
        iVar60 = 0;
        iVar31 = 0;
        iVar32 = 0;
        iVar68 = 0;
      }
      ppVar19->score = iVar60;
      ppVar19->end_query = uVar22;
      ppVar19->end_ref = iVar23;
      ((ppVar19->field_4).stats)->matches = iVar31;
      ((ppVar19->field_4).stats)->similar = iVar32;
      ((ppVar19->field_4).stats)->length = iVar68;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar19;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vNegInf0 = _mm_insert_epi64_rpl(vZero, NEG_LIMIT, 1);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_insert_epi64_rpl(vWH, -open - i*gap, 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vNM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vNS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vWM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vWS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64_rpl(vWH, vNWH);
            case2 = _mm_cmpeq_epi64_rpl(vWH, vF);
            vWM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64_rpl(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi64_rpl(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8_rpl(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8_rpl(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8_rpl(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
            similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
            length= (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
        }
        vMaxH = _mm_slli_si128(vMaxH, 8);
        vMaxM = _mm_slli_si128(vMaxM, 8);
        vMaxS = _mm_slli_si128(vMaxS, 8);
        vMaxL = _mm_slli_si128(vMaxL, 8);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}